

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigCreateChoice(Ivy_Man_t *p,Ivy_Obj_t *pObjOld,Ivy_Obj_t *pObjNew)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0xfd,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pObjOld & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0xfe,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  uVar4 = *(ulong *)(((ulong)pObjNew & 0xfffffffffffffffe) + 0x48);
  uVar5 = (ulong)pObjOld->pEquiv & 0xfffffffffffffffe;
  uVar7 = *(ulong *)(uVar5 + 0x48);
  if ((uVar7 != 0) && (uVar6 = uVar7, *(int *)(uVar5 + 0xc) < 1)) {
    for (; (uVar6 = uVar6 & 0xfffffffffffffffe, uVar6 != uVar5 && (*(int *)(uVar6 + 0xc) < 1));
        uVar6 = *(ulong *)(uVar6 + 0x48)) {
    }
    if (*(int *)(uVar6 + 0xc) < 1) goto LAB_007e999c;
    uVar5 = uVar6 | (uint)uVar7 & 1;
  }
  uVar6 = uVar4 & 0xfffffffffffffffe;
  uVar7 = *(ulong *)(uVar6 + 0x48);
  if ((uVar7 != 0) && (uVar8 = uVar7, *(int *)(uVar6 + 0xc) < 1)) {
    for (; (uVar8 = uVar8 & 0xfffffffffffffffe, uVar8 != uVar6 && (*(int *)(uVar8 + 0xc) < 1));
        uVar8 = *(ulong *)(uVar8 + 0x48)) {
    }
    if (*(int *)(uVar8 + 0xc) < 1) {
LAB_007e999c:
      __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                    ,0x3b,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
    }
    uVar6 = uVar8 | (uint)uVar7 & 1;
  }
  uVar7 = uVar5 & 0xfffffffffffffffe;
  uVar8 = uVar6 & 0xfffffffffffffffe;
  if (uVar7 != uVar8) {
    if (((*(int *)(uVar7 + 0xc) == 0) || (*(long *)(uVar8 + 0x48) != 0)) ||
       (0 < *(int *)(uVar8 + 0xc))) {
      piVar1 = &p->pHaig->nClassesSkip;
      *piVar1 = *piVar1 + 1;
    }
    else {
      if (*(int *)(uVar7 + 0xc) < 1) {
        __assert_fail("Ivy_ObjRefs(pObjOldHaigR) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                      ,0x11d,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      uVar2 = *(ulong *)(uVar7 + 0x48);
      if ((uVar2 & 1) != 0) {
        __assert_fail("!Ivy_IsComplement(pObjOldHaigR->pEquiv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                      ,0x11e,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      uVar3 = (uint)pObjOld->pEquiv ^ (uint)pObjNew ^ (uint)uVar4 ^ (uint)uVar6;
      uVar4 = uVar3 & 1 ^ uVar5;
      if (uVar2 != 0) {
        uVar4 = (uVar3 ^ (uint)uVar5) & 1 | uVar2;
      }
      *(ulong *)(uVar8 + 0x48) = uVar4;
      *(ulong *)(uVar7 + 0x48) = uVar8;
    }
  }
  return;
}

Assistant:

void Ivy_ManHaigCreateChoice( Ivy_Man_t * p, Ivy_Obj_t * pObjOld, Ivy_Obj_t * pObjNew )
{
    Ivy_Obj_t * pObjOldHaig, * pObjNewHaig;
    Ivy_Obj_t * pObjOldHaigR, * pObjNewHaigR;
    int fCompl;
//printf( "\nCreating choice for %d and %d in AIG\n", pObjOld->Id, Ivy_Regular(pObjNew)->Id );

    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObjOld) );
    // get pointers to the representatives of pObjOld and pObjNew
    pObjOldHaig = pObjOld->pEquiv;
    pObjNewHaig = Ivy_NotCond( Ivy_Regular(pObjNew)->pEquiv, Ivy_IsComplement(pObjNew) );
    // get the classes
    pObjOldHaig = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObjOldHaig)), Ivy_IsComplement(pObjOldHaig) );
    pObjNewHaig = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObjNewHaig)), Ivy_IsComplement(pObjNewHaig) );
    // get regular pointers
    pObjOldHaigR = Ivy_Regular(pObjOldHaig);
    pObjNewHaigR = Ivy_Regular(pObjNewHaig);
    // check if there is phase difference between them
    fCompl = (Ivy_IsComplement(pObjOldHaig) != Ivy_IsComplement(pObjNewHaig));
    // if the class is the same, nothing to do
    if ( pObjOldHaigR == pObjNewHaigR )
        return;
    // if the second node belongs to a class, do not merge classes (for the time being)
    if ( Ivy_ObjRefs(pObjOldHaigR) == 0 || pObjNewHaigR->pEquiv != NULL || 
        Ivy_ObjRefs(pObjNewHaigR) > 0 ) //|| Ivy_ObjIsInTfi_rec(pObjNewHaigR, pObjOldHaigR, 10) )
    {
/*
        if ( pObjNewHaigR->pEquiv != NULL )
            printf( "c" );
        if ( Ivy_ObjRefs(pObjNewHaigR) > 0 )
            printf( "f" );
        printf( " " );
*/
        p->pHaig->nClassesSkip++;
        return;
    }

    // add this node to the class of pObjOldHaig
    assert( Ivy_ObjRefs(pObjOldHaigR) > 0 );
    assert( !Ivy_IsComplement(pObjOldHaigR->pEquiv) );
    if ( pObjOldHaigR->pEquiv == NULL )
        pObjNewHaigR->pEquiv = Ivy_NotCond( pObjOldHaigR, fCompl );
    else
        pObjNewHaigR->pEquiv = Ivy_NotCond( pObjOldHaigR->pEquiv, fCompl );
    pObjOldHaigR->pEquiv = pObjNewHaigR;
//printf( "Setting choice node %d -> %d.\n", pObjOldHaigR->Id, pObjNewHaigR->Id );
    // update the class of the new node
//    Ivy_Regular(pObjNew)->pEquiv = Ivy_NotCond( pObjOldHaigR, fCompl ^ Ivy_IsComplement(pObjNew) );
//printf( "Creating choice for %d and %d in HAIG\n", pObjOldHaigR->Id, pObjNewHaigR->Id );

//    if ( pObjOldHaigR->Id == 13 )
//    {
//        Ivy_ManShow( p, 0 );
//        Ivy_ManShow( p->pHaig, 1 );
//    }
//    if ( !Ivy_ManIsAcyclic( p->pHaig ) )
//        printf( "HAIG contains a cycle\n" );
}